

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O2

void sysbvm_methodDictionary_increaseCapacity(sysbvm_context_t *context,sysbvm_tuple_t dictionary)

{
  uint uVar1;
  ulong uVar2;
  undefined8 uVar3;
  sysbvm_tuple_t sVar4;
  intptr_t iVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar2 = *(ulong *)(dictionary + 0x18);
  if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
    uVar1 = *(uint *)(uVar2 + 0xc);
    uVar7 = uVar1 >> 4;
    uVar8 = 8;
    if (0x3f < uVar1) {
      uVar8 = (ulong)(uVar1 >> 3 & 0xfffffffe);
    }
  }
  else {
    uVar7 = 0;
    uVar8 = 8;
  }
  sVar4 = sysbvm_array_create(context,(ulong)(uint)((int)uVar8 * 2));
  *(sysbvm_tuple_t *)(dictionary + 0x18) = sVar4;
  for (lVar6 = 0; uVar8 * 0x10 != lVar6; lVar6 = lVar6 + 0x10) {
    *(undefined8 *)(sVar4 + 0x10 + lVar6) = 0x3f;
  }
  for (uVar8 = 0; uVar7 << 4 != uVar8; uVar8 = uVar8 + 0x10) {
    sVar4 = *(sysbvm_tuple_t *)(uVar2 + 0x10 + uVar8);
    if (sVar4 != 0x3f) {
      uVar3 = *(undefined8 *)(uVar2 + 0x18 + uVar8);
      iVar5 = sysbvm_methodDictionary_scanFor(dictionary,sVar4);
      if (iVar5 < 0) {
        sysbvm_error_assertionFailure
                  (
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/dictionary.c:662: assertion failure: elementIndex >= 0"
                  );
      }
      lVar6 = *(long *)(dictionary + 0x18);
      *(sysbvm_tuple_t *)(lVar6 + 0x10 + iVar5 * 0x10) = sVar4;
      *(undefined8 *)(lVar6 + 0x18 + iVar5 * 0x10) = uVar3;
    }
  }
  return;
}

Assistant:

static void sysbvm_methodDictionary_increaseCapacity(sysbvm_context_t *context, sysbvm_tuple_t dictionary)
{
    sysbvm_dictionary_t *dictionaryObject = (sysbvm_dictionary_t*)dictionary;
    sysbvm_array_t *oldStorage = (sysbvm_array_t*)dictionaryObject->storage;

    size_t oldCapacity = sysbvm_tuple_getSizeInSlots(dictionaryObject->storage) / 2;
    size_t newCapacity = oldCapacity * 2;
    if(newCapacity < 8)
        newCapacity = 8;

    // Make the new storage.
    sysbvm_array_t *newStorage = (sysbvm_array_t*)sysbvm_array_create(context, newCapacity*2);
    dictionaryObject->storage = (sysbvm_tuple_t)newStorage;
    for(size_t i = 0; i < newCapacity; ++i)
        newStorage->elements[i*2] = SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE;

    // Reinsert the old elements.
    for(size_t i = 0; i < oldCapacity; ++i)
    {
        sysbvm_tuple_t key = oldStorage->elements[i*2];
        sysbvm_tuple_t value = oldStorage->elements[i*2 + 1];
        if(key != SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE)
            sysbvm_methodDictionary_insertNoCheck(dictionary, key, value);
    }
}